

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integrator.cpp
# Opt level: O0

StatWriter * __thiscall OpenMD::Integrator::createStatWriter(Integrator *this)

{
  SimInfo *pSVar1;
  void *pvVar2;
  long in_RDI;
  Stats *in_stack_00000020;
  string *in_stack_00000028;
  StatWriter *in_stack_00000030;
  SimInfo *in_stack_ffffffffffffff78;
  StatWriter *this_00;
  Stats *in_stack_ffffffffffffffa0;
  
  pSVar1 = (SimInfo *)operator_new(0x68);
  Stats::Stats(in_stack_ffffffffffffffa0,pSVar1);
  *(SimInfo **)(in_RDI + 0xc0) = pSVar1;
  pvVar2 = operator_new(0x448);
  SimInfo::getStatFileName_abi_cxx11_(in_stack_ffffffffffffff78);
  StatWriter::StatWriter(in_stack_00000030,in_stack_00000028,in_stack_00000020);
  *(void **)(in_RDI + 0xd0) = pvVar2;
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  pSVar1 = *(SimInfo **)(in_RDI + 0xd0);
  this_00 = (StatWriter *)&stack0xffffffffffffffa0;
  SimInfo::getReportFileName_abi_cxx11_(pSVar1);
  StatWriter::setReportFileName(this_00,(string *)pSVar1);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  return *(StatWriter **)(in_RDI + 0xd0);
}

Assistant:

StatWriter* Integrator::createStatWriter() {
    stats      = new Stats(info_);
    statWriter = new StatWriter(info_->getStatFileName(), stats);
    statWriter->setReportFileName(info_->getReportFileName());

    return statWriter;
  }